

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiID IVar5;
  ImGuiTable *__dest;
  int iVar6;
  
  iVar2 = this->FreeIdx;
  iVar6 = (this->Buf).Size;
  if (iVar2 == iVar6) {
    iVar1 = iVar6 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar6) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
      if (iVar3 < iVar6) {
        __dest = (ImGuiTable *)ImGui::MemAlloc((long)iVar6 * 600);
        pIVar4 = (this->Buf).Data;
        if (pIVar4 != (ImGuiTable *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->Buf).Size * 600);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar6;
      }
    }
    (this->Buf).Size = iVar1;
    IVar5 = this->FreeIdx + 1;
  }
  else {
    IVar5 = (this->Buf).Data[iVar2].ID;
  }
  this->FreeIdx = IVar5;
  pIVar4 = (this->Buf).Data;
  memset(pIVar4 + iVar2,0,600);
  pIVar4[iVar2].LastFrameActive = -1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }